

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_3000ca::ArgParser::argEncPositional(ArgParser *this,string *arg)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference pvVar1;
  allocator<char> local_39;
  value_type len_str;
  
  if (this->used_enc_password_args == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&len_str,"positional and dashed encryption arguments may not be mixed",
               &local_39);
    QPDFArgParser::usage(&this->ap,&len_str);
    std::__cxx11::string::~string((string *)&len_str);
  }
  this_00 = &this->accumulated_args;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,arg);
  if (0x40 < (ulong)((long)(this->accumulated_args).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->accumulated_args).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::at(this_00,0);
    std::__cxx11::string::_M_assign((string *)&this->user_password);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::at(this_00,1);
    std::__cxx11::string::_M_assign((string *)&this->owner_password);
    pvVar1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(this_00,2);
    std::__cxx11::string::string((string *)&len_str,(string *)pvVar1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(this_00);
    argEncBits(this,&len_str);
    std::__cxx11::string::~string((string *)&len_str);
  }
  return;
}

Assistant:

void
ArgParser::argEncPositional(std::string const& arg)
{
    if (used_enc_password_args) {
        usage("positional and dashed encryption arguments may not be mixed");
    }

    this->accumulated_args.push_back(arg);
    if (this->accumulated_args.size() < 3) {
        return;
    }
    user_password = this->accumulated_args.at(0);
    owner_password = this->accumulated_args.at(1);
    auto len_str = this->accumulated_args.at(2);
    this->accumulated_args.clear();
    argEncBits(len_str);
}